

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_mstring_get_mbs(archive_conflict *a,archive_mstring *aes,char **p)

{
  wchar_t wVar1;
  archive_string_conv *sc_00;
  wchar_t local_38;
  wchar_t ret;
  wchar_t r;
  archive_string_conv *sc;
  char **p_local;
  archive_mstring *aes_local;
  archive_conflict *a_local;
  
  local_38 = L'\0';
  if ((aes->aes_set & 1U) == 0) {
    *p = (char *)0x0;
    if ((aes->aes_set & 4U) != 0) {
      (aes->aes_mbs).length = 0;
      wVar1 = archive_string_append_from_wcs(&aes->aes_mbs,(aes->aes_wcs).s,(aes->aes_wcs).length);
      *p = (aes->aes_mbs).s;
      if (wVar1 == L'\0') {
        aes->aes_set = aes->aes_set | 1;
        return L'\0';
      }
      local_38 = L'\xffffffff';
    }
    if ((aes->aes_set & 2U) != 0) {
      (aes->aes_mbs).length = 0;
      sc_00 = archive_string_conversion_from_charset(a,"UTF-8",L'\x01');
      if (sc_00 == (archive_string_conv *)0x0) {
        return L'\xffffffff';
      }
      wVar1 = archive_strncpy_l(&aes->aes_mbs,(aes->aes_utf8).s,(aes->aes_utf8).length,sc_00);
      if (a == (archive_conflict *)0x0) {
        free_sconv_object(sc_00);
      }
      *p = (aes->aes_mbs).s;
      if (wVar1 == L'\0') {
        aes->aes_set = aes->aes_set | 1;
        local_38 = L'\0';
      }
      else {
        local_38 = L'\xffffffff';
      }
    }
    a_local._4_4_ = local_38;
  }
  else {
    *p = (aes->aes_mbs).s;
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

int
archive_mstring_get_mbs(struct archive *a, struct archive_mstring *aes,
    const char **p)
{
	struct archive_string_conv *sc;
	int r, ret = 0;

	/* If we already have an MBS form, return that immediately. */
	if (aes->aes_set & AES_SET_MBS) {
		*p = aes->aes_mbs.s;
		return (ret);
	}

	*p = NULL;
	/* If there's a WCS form, try converting with the native locale. */
	if (aes->aes_set & AES_SET_WCS) {
		archive_string_empty(&(aes->aes_mbs));
		r = archive_string_append_from_wcs(&(aes->aes_mbs),
		    aes->aes_wcs.s, aes->aes_wcs.length);
		*p = aes->aes_mbs.s;
		if (r == 0) {
			aes->aes_set |= AES_SET_MBS;
			return (ret);
		} else
			ret = -1;
	}

	/* If there's a UTF-8 form, try converting with the native locale. */
	if (aes->aes_set & AES_SET_UTF8) {
		archive_string_empty(&(aes->aes_mbs));
		sc = archive_string_conversion_from_charset(a, "UTF-8", 1);
		if (sc == NULL)
			return (-1);/* Couldn't allocate memory for sc. */
		r = archive_strncpy_l(&(aes->aes_mbs),
			aes->aes_utf8.s, aes->aes_utf8.length, sc);
		if (a == NULL)
			free_sconv_object(sc);
		*p = aes->aes_mbs.s;
		if (r == 0) {
			aes->aes_set |= AES_SET_MBS;
			ret = 0;/* success; overwrite previous error. */
		} else
			ret = -1;/* failure. */
	}
	return (ret);
}